

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O0

int avl_comp_cfgio(void *txt1,void *txt2)

{
  char *pcVar1;
  size_t local_40;
  ssize_t maxlen;
  char *ptr;
  char *url2;
  char *url1;
  void *txt2_local;
  void *txt1_local;
  
  local_40 = 0xffffffffffffffff;
  pcVar1 = strstr((char *)txt1,"://");
  if (pcVar1 != (char *)0x0) {
    local_40 = (long)pcVar1 - (long)txt1;
  }
  pcVar1 = strstr((char *)txt2,"://");
  if ((pcVar1 != (char *)0x0) && ((long)local_40 < (long)pcVar1 - (long)txt2)) {
    local_40 = (long)pcVar1 - (long)txt2;
  }
  if (local_40 == 0xffffffffffffffff) {
    txt1_local._4_4_ = strcasecmp((char *)txt1,(char *)txt2);
  }
  else {
    txt1_local._4_4_ = strncasecmp((char *)txt1,(char *)txt2,local_40);
  }
  return txt1_local._4_4_;
}

Assistant:

static int
avl_comp_cfgio(const void *txt1, const void *txt2) {
  const char *url1 = txt1;
  const char *url2 = txt2;
  const char *ptr;
  ssize_t maxlen = -1;

  ptr = strstr(url1, CFG_IO_URL_SPLITTER);
  if (ptr) {
    maxlen = ptr - url1;
  }
  ptr = strstr(url2, CFG_IO_URL_SPLITTER);
  if (ptr) {
    if ((ptr - url2) > maxlen) {
      maxlen = ptr - url2;
    }
  }

  if (maxlen != -1) {
    return strncasecmp(url1, url2, maxlen);
  }
  return strcasecmp(txt1, txt2);
}